

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::setRngSeed(ConfigData *config,string *seed)

{
  bool bVar1;
  time_t tVar2;
  runtime_error *this;
  stringstream ss;
  ostream local_188 [16];
  byte abStack_178 [360];
  
  bVar1 = std::operator==(seed,"time");
  if (bVar1) {
    tVar2 = time((time_t *)0x0);
    config->rngSeed = (uint)tVar2;
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::operator<<(local_188,(string *)seed);
    std::istream::_M_extract<unsigned_int>((uint *)&ss);
    if ((abStack_178[*(long *)(_ss + -0x18)] & 5) != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this,"Argment to --rng-seed should be the word \'time\' or a number");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  return;
}

Assistant:

inline void setRngSeed( ConfigData& config, std::string const& seed ) {
        if( seed == "time" ) {
            config.rngSeed = static_cast<unsigned int>( std::time(0) );
        }
        else {
            std::stringstream ss;
            ss << seed;
            ss >> config.rngSeed;
            if( ss.fail() )
                throw std::runtime_error( "Argment to --rng-seed should be the word 'time' or a number" );
        }
    }